

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

bool tcu::isValid(TextureFormat format)

{
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  ChannelOrder CStack_14;
  bool isColor;
  TextureFormat format_local;
  
  CStack_14 = format.order;
  format_local.order._3_1_ = anon_unknown_75::isColorOrder(CStack_14);
  switch((ulong)format >> 0x20) {
  case 0:
  case 1:
  case 2:
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    local_21 = (bool)format_local.order._3_1_ || CStack_14 == D;
    format_local.order._3_1_ = local_21;
    break;
  case 7:
  case 0x10:
    format_local.order._3_1_ = CStack_14 == RG;
    break;
  case 8:
  case 9:
  case 0x11:
    local_22 = CStack_14 == RGB || CStack_14 == BGR;
    format_local.order._3_1_ = local_22;
    break;
  case 10:
  case 0xb:
  case 0x12:
  case 0x13:
    local_23 = CStack_14 == RGBA || CStack_14 == BGRA;
    format_local.order._3_1_ = local_23;
    break;
  case 0xc:
    format_local.order._3_1_ = CStack_14 == ARGB;
    break;
  case 0xd:
    format_local.order._3_1_ = CStack_14 == RGB;
    break;
  case 0xe:
  case 0xf:
  case 0x14:
  case 0x15:
    local_24 = CStack_14 == RGBA || CStack_14 == BGRA;
    format_local.order._3_1_ = local_24;
    break;
  case 0x16:
  case 0x17:
    format_local.order._3_1_ = CStack_14 == RGB;
    break;
  case 0x18:
    format_local.order._3_1_ = CStack_14 == DS;
    break;
  case 0x19:
  case 0x1a:
    local_25 = CStack_14 == D || CStack_14 == DS;
    format_local.order._3_1_ = local_25;
    break;
  case 0x1b:
  case 0x1c:
  case 0x1d:
    break;
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
    local_26 = (bool)format_local.order._3_1_ || CStack_14 == S;
    format_local.order._3_1_ = local_26;
    break;
  case 0x22:
  case 0x23:
  case 0x24:
    local_27 = (bool)format_local.order._3_1_ || CStack_14 == D;
    format_local.order._3_1_ = local_27;
    break;
  case 0x25:
    format_local.order._3_1_ = CStack_14 == DS;
    break;
  default:
    format_local.order._3_1_ = R >> 0x18;
  }
  return (bool)format_local.order._3_1_;
}

Assistant:

bool isValid (TextureFormat format)
{
	const bool	isColor	= isColorOrder(format.order);

	switch (format.type)
	{
		case TextureFormat::SNORM_INT8:
		case TextureFormat::SNORM_INT16:
		case TextureFormat::SNORM_INT32:
			return isColor;

		case TextureFormat::UNORM_INT8:
		case TextureFormat::UNORM_INT16:
		case TextureFormat::UNORM_INT24:
		case TextureFormat::UNORM_INT32:
			return isColor || format.order == TextureFormat::D;

		case TextureFormat::UNORM_BYTE_44:
		case TextureFormat::UNSIGNED_BYTE_44:
			return format.order == TextureFormat::RG;

		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNORM_SHORT_555:
		case TextureFormat::UNSIGNED_SHORT_565:
			return format.order == TextureFormat::RGB || format.order == TextureFormat::BGR;

		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNSIGNED_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_5551:
			return format.order == TextureFormat::RGBA || format.order == TextureFormat::BGRA;

		case TextureFormat::UNORM_SHORT_1555:
			return format.order == TextureFormat::ARGB;

		case TextureFormat::UNORM_INT_101010:
			return format.order == TextureFormat::RGB;

		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			return format.order == TextureFormat::RGBA || format.order == TextureFormat::BGRA;

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			return format.order == TextureFormat::RGB;

		case TextureFormat::UNSIGNED_INT_16_8_8:
			return format.order == TextureFormat::DS;

		case TextureFormat::UNSIGNED_INT_24_8:
		case TextureFormat::UNSIGNED_INT_24_8_REV:
			return format.order == TextureFormat::D || format.order == TextureFormat::DS;

		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
			return isColor;

		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT24:
		case TextureFormat::UNSIGNED_INT32:
			return isColor || format.order == TextureFormat::S;

		case TextureFormat::HALF_FLOAT:
		case TextureFormat::FLOAT:
		case TextureFormat::FLOAT64:
			return isColor || format.order == TextureFormat::D;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			return format.order == TextureFormat::DS;

		default:
			DE_FATAL("Unknown format");
			return 0u;
	}

	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);
}